

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::execute_simple_append_interactive
               (string *first_geo,string *second_geo,string *output_geo,string *char_len)

{
  string sStack_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)first_geo);
  std::__cxx11::string::string((string *)&local_58,(string *)second_geo);
  std::__cxx11::string::string((string *)&local_78,(string *)output_geo);
  std::__cxx11::string::string((string *)&sStack_98,(string *)char_len);
  simple_append(&local_38,&local_58,&local_78,&sStack_98);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void UI::execute_simple_append_interactive( std::string first_geo,
                                            std::string second_geo,
                                            std::string output_geo,
                                            std::string char_len)
{
    simple_append(first_geo, second_geo, output_geo, char_len);
}